

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O0

Float pbrt::InvertCatmullRom(span<const_float> x,span<const_float> values,Float u)

{
  float fVar1;
  undefined1 auVar2 [16];
  anon_class_40_5_71e24d41 f;
  float fVar3;
  size_t sVar4;
  float *pfVar5;
  ulong uVar6;
  float in_XMM0_Da;
  float fVar7;
  Float FVar8;
  Float t;
  anon_class_40_5_71e24d41 eval;
  Float d1;
  Float d0;
  Float width;
  Float f1;
  Float f0;
  Float x1;
  Float x0;
  int i;
  anon_class_16_2_e5cbf39e *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined1 local_b8 [8];
  enable_if_t<std::is_integral<int>::value> *in_stack_ffffffffffffff50;
  Float in_stack_ffffffffffffff58;
  Float in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  float *pfVar9;
  float *pfVar10;
  Float *pFVar11;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  span<const_float> *local_40;
  float *local_38;
  int local_30;
  float local_2c;
  span<const_float> local_28;
  span<const_float> local_18;
  float local_4;
  
  local_2c = in_XMM0_Da;
  fVar7 = pstd::span<const_float>::front(&local_28);
  if (fVar7 < in_XMM0_Da) {
    fVar7 = pstd::span<const_float>::back(&local_28);
    if (local_2c < fVar7) {
      pstd::span<const_float>::size(&local_28);
      local_40 = &local_28;
      local_38 = &local_2c;
      sVar4 = FindInterval<pbrt::InvertCatmullRom(pstd::span<float_const>,pstd::span<float_const>,float)::__0>
                        (CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                         in_stack_ffffffffffffff28);
      local_30 = (int)sVar4;
      pfVar5 = pstd::span<const_float>::operator[](&local_18,(long)local_30);
      local_44 = *pfVar5;
      pfVar5 = pstd::span<const_float>::operator[](&local_18,(long)(local_30 + 1));
      local_48 = *pfVar5;
      pfVar5 = pstd::span<const_float>::operator[](&local_28,(long)local_30);
      local_4c = *pfVar5;
      pfVar5 = pstd::span<const_float>::operator[](&local_28,(long)(local_30 + 1));
      local_58 = *pfVar5;
      fVar7 = local_48 - local_44;
      local_54 = fVar7;
      local_50 = local_58;
      if (local_30 < 1) {
        local_58 = local_58 - local_4c;
      }
      else {
        pfVar5 = pstd::span<const_float>::operator[](&local_28,(long)(local_30 + -1));
        fVar3 = local_48;
        fVar1 = *pfVar5;
        pfVar5 = pstd::span<const_float>::operator[](&local_18,(long)(local_30 + -1));
        local_58 = (fVar7 * (local_58 - fVar1)) / (fVar3 - *pfVar5);
      }
      uVar6 = (ulong)(local_30 + 2);
      sVar4 = pstd::span<const_float>::size(&local_18);
      fVar7 = local_54;
      if (uVar6 < sVar4) {
        pfVar5 = pstd::span<const_float>::operator[](&local_28,(long)(local_30 + 2));
        fVar1 = *pfVar5 - local_4c;
        pfVar5 = pstd::span<const_float>::operator[](&local_18,(long)(local_30 + 2));
        local_5c = (fVar7 * fVar1) / (*pfVar5 - local_44);
      }
      else {
        local_5c = local_50 - local_4c;
      }
      pfVar5 = &local_4c;
      pfVar9 = &local_50;
      pfVar10 = &local_58;
      pFVar11 = &local_5c;
      memcpy(local_b8,&stack0xffffffffffffff78,0x28);
      f.f0._4_4_ = in_stack_ffffffffffffff74;
      f.f0._0_4_ = in_stack_ffffffffffffff70;
      f.f1 = pfVar5;
      f.d0 = pfVar9;
      f.d1 = pfVar10;
      f.u = pFVar11;
      FVar8 = NewtonBisection<int,pbrt::InvertCatmullRom(pstd::span<float_const>,pstd::span<float_const>,float)::__1>
                        (in_stack_ffffffffffffff64,in_stack_ffffffffffffff60,f,
                         in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
                         in_stack_ffffffffffffff50);
      auVar2 = vfmadd213ss_fma(ZEXT416((uint)local_54),ZEXT416((uint)FVar8),ZEXT416((uint)local_44))
      ;
      local_4 = auVar2._0_4_;
    }
    else {
      local_4 = pstd::span<const_float>::back(&local_18);
    }
  }
  else {
    local_4 = pstd::span<const_float>::front(&local_18);
  }
  return local_4;
}

Assistant:

Float InvertCatmullRom(pstd::span<const Float> x, pstd::span<const Float> values,
                       Float u) {
    // Stop when _u_ is out of bounds
    if (!(u > values.front()))
        return x.front();
    else if (!(u < values.back()))
        return x.back();

    // Map _u_ to a spline interval by inverting _values_
    int i = FindInterval(values.size(), [&](int i) { return values[i] <= u; });

    // Look up $x_i$ and function values of spline segment _i_
    Float x0 = x[i], x1 = x[i + 1];
    Float f0 = values[i], f1 = values[i + 1];
    Float width = x1 - x0;

    // Approximate derivatives using finite differences
    Float d0, d1;
    if (i > 0)
        d0 = width * (f1 - values[i - 1]) / (x1 - x[i - 1]);
    else
        d0 = f1 - f0;
    if (i + 2 < x.size())
        d1 = width * (values[i + 2] - f0) / (x[i + 2] - x0);
    else
        d1 = f1 - f0;

    auto eval = [&](Float t) -> std::pair<Float, Float> {
        // Compute powers of _t_
        Float t2 = t * t, t3 = t2 * t;

        // Set _Fhat_ using Equation (8.27)
        Float Fhat = (2 * t3 - 3 * t2 + 1) * f0 + (-2 * t3 + 3 * t2) * f1 +
                     (t3 - 2 * t2 + t) * d0 + (t3 - t2) * d1;
        // Set _fhat_ using Equation (not present)
        Float fhat = (6 * t2 - 6 * t) * f0 + (-6 * t2 + 6 * t) * f1 +
                     (3 * t2 - 4 * t + 1) * d0 + (3 * t2 - 2 * t) * d1;
        return {Fhat - u, fhat};
    };
    Float t = NewtonBisection(0, 1, eval);

    return x0 + t * width;
}